

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O0

void __thiscall nesvis::PpuWidget::load_pattern_tables(PpuWidget *this)

{
  reference pvVar1;
  Texture local_78;
  int local_50;
  int i_1;
  Texture local_40;
  int local_18;
  undefined2 local_12;
  int i;
  uint16_t palette;
  PpuWidget *this_local;
  
  local_12 = 0;
  _i = this;
  for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
    PpuHelper::get_pattern_table_texture(&local_40,this->ppu_helper_,(uint16_t)local_18,0,0);
    pvVar1 = std::array<sf::Texture,_512UL>::operator[]
                       (&this->pattern_table_textures_,(long)local_18);
    sf::Texture::operator=(pvVar1,&local_40);
    sf::Texture::~Texture(&local_40);
  }
  for (local_50 = 0; local_50 < 0x100; local_50 = local_50 + 1) {
    PpuHelper::get_pattern_table_texture(&local_78,this->ppu_helper_,(uint16_t)local_50,1,0);
    pvVar1 = std::array<sf::Texture,_512UL>::operator[]
                       (&this->pattern_table_textures_,(long)(local_50 + 0x100));
    sf::Texture::operator=(pvVar1,&local_78);
    sf::Texture::~Texture(&local_78);
  }
  return;
}

Assistant:

void PpuWidget::load_pattern_tables() {
    const uint16_t palette = 0; // TODO(jn) update to correct index
    for (int i = 0; i < kPatternTableSize; ++i) {
        pattern_table_textures_[i] =
                ppu_helper_->get_pattern_table_texture(i, 0, palette);
    }

    for (int i = 0; i < kPatternTableSize; ++i) {
        pattern_table_textures_[kPatternTableSize + i] =
                ppu_helper_->get_pattern_table_texture(i, 1, palette);
    }
}